

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int attrset_set_attr(BigAttrSet *attrset,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  BigAttr *pBVar7;
  int *piVar8;
  char **ppcVar9;
  size_t sVar10;
  ulong uVar11;
  char *dst;
  char ndtype [8];
  char local_58 [16];
  char *local_48;
  undefined8 uStack_40;
  
  attrset->dirty = 1;
  pcVar2 = strchr(attrname,0x20);
  if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(attrname,9), pcVar2 == (char *)0x0)) &&
     (pcVar2 = strchr(attrname,10), pcVar2 == (char *)0x0)) {
    uStack_40 = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_48 = attrname;
    pvVar3 = bsearch(local_58,attrset->attrlist,attrset->listused,0x20,attr_cmp);
    if (pvVar3 != (void *)0x0) {
      attrset_remove_attr(attrset,attrname);
    }
    _dtype_normalize(local_58,dtype);
    iVar1 = atoi(local_58 + 2);
    sVar4 = strlen(attrname);
    uVar11 = (long)(iVar1 * nmemb) + sVar4 + 1;
    sVar6 = attrset->bufsize;
    sVar5 = attrset->bufused;
    while (sVar6 - sVar5 < uVar11) {
      sVar5 = attrset->listused;
      if (sVar5 != 0) {
        pcVar2 = attrset->attrbuf;
        ppcVar9 = &attrset->attrlist->data;
        do {
          *ppcVar9 = *ppcVar9 + -(long)pcVar2;
          ppcVar9[-1] = ppcVar9[-1] + -(long)pcVar2;
          ppcVar9 = ppcVar9 + 4;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      pcVar2 = (char *)realloc(attrset->attrbuf,sVar6 * 2);
      attrset->attrbuf = pcVar2;
      sVar5 = attrset->listused;
      sVar6 = attrset->bufsize * 2;
      attrset->bufsize = sVar6;
      if (sVar5 != 0) {
        ppcVar9 = &attrset->attrlist->data;
        do {
          *ppcVar9 = *ppcVar9 + (long)pcVar2;
          ppcVar9[-1] = ppcVar9[-1] + (long)pcVar2;
          ppcVar9 = ppcVar9 + 4;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      sVar5 = attrset->bufused;
    }
    pcVar2 = attrset->attrbuf;
    sVar6 = attrset->listused;
    attrset->bufused = uVar11 + sVar5;
    sVar10 = attrset->listsize;
    while (sVar10 == sVar6) {
      pBVar7 = (BigAttr *)realloc(attrset->attrlist,sVar10 << 6);
      attrset->attrlist = pBVar7;
      sVar6 = attrset->listused;
      sVar10 = attrset->listsize * 2;
      attrset->listsize = sVar10;
    }
    pcVar2 = pcVar2 + sVar5;
    attrset->listused = sVar6 + 1;
    pBVar7 = attrset->attrlist + sVar6;
    dst = pBVar7->dtype;
    pBVar7->nmemb = 0;
    pBVar7->dtype[0] = '\0';
    pBVar7->dtype[1] = '\0';
    pBVar7->dtype[2] = '\0';
    pBVar7->dtype[3] = '\0';
    *(undefined8 *)(pBVar7->dtype + 4) = 0;
    pBVar7->name = (char *)0x0;
    pBVar7->data = (char *)0x0;
    pBVar7->nmemb = nmemb;
    dst[0] = '\0';
    dst[1] = '\0';
    dst[2] = '\0';
    dst[3] = '\0';
    dst[4] = '\0';
    dst[5] = '\0';
    dst[6] = '\0';
    dst[7] = '\0';
    _dtype_normalize(dst,dtype);
    pBVar7->name = pcVar2;
    strcpy(pcVar2,attrname);
    sVar4 = strlen(attrname);
    pBVar7->data = pcVar2 + sVar4 + 1;
    qsort(attrset->attrlist,attrset->listused,0x20,attr_cmp);
    uStack_40 = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_48 = attrname;
    piVar8 = (int *)bsearch(local_58,attrset->attrlist,attrset->listused,0x20,attr_cmp);
    if (*piVar8 == nmemb) {
      iVar1 = dtype_convert_simple
                        (*(void **)(piVar8 + 6),(char *)(piVar8 + 1),data,dtype,(long)*piVar8);
      return iVar1;
    }
    pcVar2 = "attr nmemb mismatch";
    iVar1 = 0x6d1;
  }
  else {
    pcVar2 = "Attribute name cannot contain blanks (space, tab or newline)";
    iVar1 = 0x6c4;
  }
  _big_file_raise(pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar1);
  return -1;
}

Assistant:

static int
attrset_set_attr(BigAttrSet * attrset, const char * attrname, const void * data, const char * dtype, int nmemb)
{
    BigAttr * attr;
    attrset->dirty = 1;

    RAISEIF (
         strchr(attrname, ' ')
      || strchr(attrname, '\t')
      || strchr(attrname, '\n'),
      ex_name,
      "Attribute name cannot contain blanks (space, tab or newline)"
    );

    /* Remove it if it exists*/
    attr = attrset_lookup_attr(attrset, attrname);
    if(attr)
        attrset_remove_attr(attrset, attrname);
    /* add ensures the dtype has been normalized! */
    RAISEIF(0 != attrset_add_attr(attrset, attrname, dtype, nmemb),
            ex_add,
            "Failed to add attr");
    attr = attrset_lookup_attr(attrset, attrname);
    RAISEIF(attr->nmemb != nmemb,
            ex_mismatch,
            "attr nmemb mismatch");
    return dtype_convert_simple(attr->data, attr->dtype, data, dtype, attr->nmemb);

ex_name:
ex_mismatch:
ex_add:
    return -1;
}